

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cc
# Opt level: O2

void __thiscall tt::CountDownLatch::countDown(CountDownLatch *this)

{
  int *piVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  piVar1 = &this->m_count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    pthread_cond_broadcast((pthread_cond_t *)&(this->m_condition).m_cond);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void tt::CountDownLatch::countDown(){
	MutexLockGuard lock(m_mutex);
	--m_count;
	if(m_count == 0) m_condition.notifyAll();
}